

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.h
# Opt level: O2

void o3dgc::EncodeIntACEGC
               (long predResidual,Arithmetic_Codec *ace,Adaptive_Data_Model *mModelValues,
               Static_Bit_Model *bModel0,Adaptive_Bit_Model *bModel1,unsigned_long M)

{
  uint data;
  ulong uVar1;
  
  uVar1 = predResidual >> 0x3f ^ predResidual * 2;
  data = (uint)uVar1;
  if (uVar1 < M) {
    Arithmetic_Codec::encode(ace,data,mModelValues);
    return;
  }
  Arithmetic_Codec::encode(ace,(uint)M,mModelValues);
  Arithmetic_Codec::ExpGolombEncode(ace,data - (uint)M,0,bModel0,bModel1);
  return;
}

Assistant:

inline void EncodeIntACEGC(long predResidual, 
                               Arithmetic_Codec & ace,
                               Adaptive_Data_Model & mModelValues,
                               Static_Bit_Model & bModel0,
                               Adaptive_Bit_Model & bModel1,
                               const unsigned long M)
    {
        unsigned long uiValue = IntToUInt(predResidual);
        if (uiValue < M) 
        {
            ace.encode(uiValue, mModelValues);
        }
        else 
        {
            ace.encode(M, mModelValues);
            ace.ExpGolombEncode(uiValue-M, 0, bModel0, bModel1);
        }
    }